

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c
# Opt level: O0

void uv__async_io(uv_loop_t *loop,uv__io_t *w,uint events)

{
  int iVar1;
  int *piVar2;
  uv__queue *q_00;
  int *pending;
  uv_async_t *h;
  uv__queue *q;
  uv__queue queue;
  ssize_t r;
  char buf [1024];
  uint events_local;
  uv__io_t *w_local;
  uv_loop_t *loop_local;
  
  if (w != &loop->async_io_watcher) {
    __assert_fail("w == &loop->async_io_watcher",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/async.c"
                  ,0x8c,"void uv__async_io(uv_loop_t *, uv__io_t *, unsigned int)");
  }
  while( true ) {
    do {
      queue.prev = (uv__queue *)read(w->fd,&r,0x400);
    } while (queue.prev == (uv__queue *)0x400);
    if (((queue.prev != (uv__queue *)0xffffffffffffffff) ||
        (piVar2 = __errno_location(), *piVar2 == 0xb)) ||
       (piVar2 = __errno_location(), *piVar2 == 0xb)) break;
    piVar2 = __errno_location();
    if (*piVar2 != 4) {
      abort();
    }
  }
  uv__queue_move(&loop->async_handles,(uv__queue *)&q);
  while (iVar1 = uv__queue_empty((uv__queue *)&q), iVar1 == 0) {
    q_00 = uv__queue_head((uv__queue *)&q);
    uv__queue_remove(q_00);
    uv__queue_insert_tail(&loop->async_handles,q_00);
    piVar2 = (int *)((long)&q_00[1].next + 4);
    LOCK();
    iVar1 = *piVar2;
    *piVar2 = 0;
    UNLOCK();
    if ((iVar1 != 0) && (q_00[-1].prev != (uv__queue *)0x0)) {
      (*(code *)q_00[-1].prev)(&q_00[-5].prev);
    }
  }
  return;
}

Assistant:

static void uv__async_io(uv_loop_t* loop, uv__io_t* w, unsigned int events) {
  char buf[1024];
  ssize_t r;
  struct uv__queue queue;
  struct uv__queue* q;
  uv_async_t* h;
  _Atomic int *pending;

  assert(w == &loop->async_io_watcher);

  for (;;) {
    r = read(w->fd, buf, sizeof(buf));

    if (r == sizeof(buf))
      continue;

    if (r != -1)
      break;

    if (errno == EAGAIN || errno == EWOULDBLOCK)
      break;

    if (errno == EINTR)
      continue;

    abort();
  }

  uv__queue_move(&loop->async_handles, &queue);
  while (!uv__queue_empty(&queue)) {
    q = uv__queue_head(&queue);
    h = uv__queue_data(q, uv_async_t, queue);

    uv__queue_remove(q);
    uv__queue_insert_tail(&loop->async_handles, q);

    /* Atomically fetch and clear pending flag */
    pending = (_Atomic int*) &h->pending;
    if (atomic_exchange(pending, 0) == 0)
      continue;

    if (h->async_cb == NULL)
      continue;

    h->async_cb(h);
  }
}